

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O0

btCollisionShape * __thiscall
btCollisionWorldImporter::createCylinderShapeX
          (btCollisionWorldImporter *this,btScalar radius,btScalar height)

{
  btCollisionShape *this_00;
  btCylinderShapeX *in_RDI;
  btCylinderShapeX *shape;
  btVector3 *in_stack_ffffffffffffffa8;
  btVector3 local_28;
  btCollisionShape *local_18;
  btScalar local_10;
  btScalar local_c [3];
  
  this_00 = (btCollisionShape *)btCylinderShapeX::operator_new(0x187829);
  btVector3::btVector3(&local_28,&local_10,local_c,local_c);
  btCylinderShapeX::btCylinderShapeX(in_RDI,in_stack_ffffffffffffffa8);
  local_18 = this_00;
  btAlignedObjectArray<btCollisionShape_*>::push_back
            ((btAlignedObjectArray<btCollisionShape_*> *)this_00,(btCollisionShape **)this_00);
  return local_18;
}

Assistant:

btCollisionShape* btCollisionWorldImporter::createCylinderShapeX(btScalar radius,btScalar height)
{
	btCylinderShapeX* shape = new btCylinderShapeX(btVector3(height,radius,radius));
	m_allocatedCollisionShapes.push_back(shape);
	return shape;
}